

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = get_bits(this,0x10);
  uVar2 = get_bits(this,8);
  this->m_comps_in_scan = uVar2;
  if ((uVar2 - 5 < 0xfffffffc) || (uVar1 != uVar2 * 2 + 6)) {
    stop_decoding(this,JPGD_BAD_SOS_LENGTH);
  }
  uVar8 = 0;
  do {
    uVar3 = get_bits(this,8);
    uVar4 = get_bits(this,8);
    if ((long)this->m_comps_in_frame < 1) {
LAB_0014f5e9:
      stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
    }
    uVar5 = 0;
    while (uVar3 != this->m_comp_ident[uVar5]) {
      uVar5 = uVar5 + 1;
      if ((long)this->m_comps_in_frame == uVar5) goto LAB_0014f5e9;
    }
    if (3 < uVar5) {
LAB_0014f5f6:
      stop_decoding(this,JPGD_DECODE_ERROR);
    }
    this->m_comp_list[uVar8] = (int)uVar5;
    uVar6 = uVar4 >> 4 & 0xf;
    this->m_comp_dc_tab[uVar5] = uVar6;
    this->m_comp_ac_tab[uVar5] = (uVar4 & 0xf) + 4;
    if ((7 < uVar6) || (3 < (uVar4 & 0xf))) goto LAB_0014f5f6;
    uVar8 = uVar8 + 1;
    if (uVar8 == uVar2) {
      uVar3 = get_bits(this,8);
      this->m_spectral_start = uVar3;
      uVar3 = get_bits(this,8);
      this->m_spectral_end = uVar3;
      uVar3 = get_bits(this,4);
      this->m_successive_high = uVar3;
      uVar3 = get_bits(this,4);
      this->m_successive_low = uVar3;
      if (this->m_progressive_flag == 0) {
        this->m_spectral_start = 0;
        this->m_spectral_end = 0x3f;
      }
      for (iVar7 = ((uVar1 - uVar2) - uVar2) + -6; iVar7 != 0; iVar7 = iVar7 + -1) {
        get_bits(this,8);
      }
      return;
    }
  } while( true );
}

Assistant:

void jpeg_decoder::read_sos_marker()
	{
		uint num_left;
		int i, ci, n, c, cc;

		num_left = get_bits(16);

		n = get_bits(8);

		m_comps_in_scan = n;

		num_left -= 3;

		if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
			stop_decoding(JPGD_BAD_SOS_LENGTH);

		for (i = 0; i < n; i++)
		{
			cc = get_bits(8);
			c = get_bits(8);
			num_left -= 2;

			for (ci = 0; ci < m_comps_in_frame; ci++)
				if (cc == m_comp_ident[ci])
					break;

			if (ci >= m_comps_in_frame)
				stop_decoding(JPGD_BAD_SOS_COMP_ID);

			if (ci >= JPGD_MAX_COMPONENTS)
				stop_decoding(JPGD_DECODE_ERROR);

			m_comp_list[i] = ci;

			m_comp_dc_tab[ci] = (c >> 4) & 15;
			m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);

			if (m_comp_dc_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);

			if (m_comp_ac_tab[ci] >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_DECODE_ERROR);
		}

		m_spectral_start = get_bits(8);
		m_spectral_end = get_bits(8);
		m_successive_high = get_bits(4);
		m_successive_low = get_bits(4);

		if (!m_progressive_flag)
		{
			m_spectral_start = 0;
			m_spectral_end = 63;
		}

		num_left -= 3;

		/* read past whatever is num_left */
		while (num_left)
		{
			get_bits(8);
			num_left--;
		}
	}